

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3RenameTokenRemap(Parse *pParse,void *pTo,void *pFrom)

{
  RenameToken *pRVar1;
  RenameToken **ppRVar2;
  
  ppRVar2 = &pParse->pRename;
  while( true ) {
    pRVar1 = *ppRVar2;
    if (pRVar1 == (RenameToken *)0x0) {
      return;
    }
    if (pRVar1->p == pFrom) break;
    ppRVar2 = &pRVar1->pNext;
  }
  pRVar1->p = pTo;
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3RenameTokenRemap(Parse *pParse, void *pTo, void *pFrom){
  RenameToken *p;
  renameTokenCheckAll(pParse, pTo);
  for(p=pParse->pRename; p; p=p->pNext){
    if( p->p==pFrom ){
      p->p = pTo;
      break;
    }
  }
}